

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
mxx::allgatherv<int>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,int *data,size_t size,
          comm *comm)

{
  undefined1 local_40 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_sizes;
  comm *comm_local;
  size_t size_local;
  int *data_local;
  
  recv_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)comm;
  comm_local = (comm *)size;
  size_local = (size_t)data;
  data_local = (int *)__return_storage_ptr__;
  allgather<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,
             (unsigned_long *)&comm_local,comm);
  allgatherv<int>(__return_storage_ptr__,(int *)size_local,(size_t)comm_local,
                  (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,
                  (comm *)recv_sizes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> allgatherv(const T* data, size_t size, const mxx::comm& comm = mxx::comm()) {
    // recv_sizes is unknown -> first collect via gather
    std::vector<size_t> recv_sizes = allgather(size, comm);
    return allgatherv(data, size, recv_sizes, comm);
}